

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this,
          initializer_list<pstore::command_line::literal> init)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  value_type *__value;
  ulong uVar3;
  back_insert_iterator<pstore::small_vector<pstore::command_line::literal,_3UL>_> local_28;
  
  uVar3 = init._M_len;
  __value = init._M_array;
  this->elements_ = 0;
  paVar1 = &(this->small_buffer_)._M_elems[0].description.field_2;
  lVar2 = 0xd8;
  do {
    *(undefined8 *)((long)paVar1 + -0x18) = 0;
    (((string *)(paVar1 + -1))->_M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar1 + -0x28) = 0;
    paVar1[-2]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar1 + 8) = 0;
    *(undefined8 **)((long)paVar1 + -0x38) = (undefined8 *)((long)paVar1 + -0x28);
    paVar1[-3]._M_allocated_capacity = 0;
    (((string *)(paVar1 + -1))->_M_dataplus)._M_p = (pointer)paVar1;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar1 + 0x48);
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != 0);
  (this->big_buffer_).
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->big_buffer_).
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->big_buffer_).
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->buffer_ = (this->small_buffer_)._M_elems;
  if (3 < uVar3) {
    std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
    reserve(&this->big_buffer_,uVar3);
  }
  if (0 < (long)uVar3) {
    uVar3 = uVar3 + 1;
    local_28.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<pstore::command_line::literal,_3UL>_>::
      operator=(&local_28,__value);
      __value = __value + 1;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }